

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  bool bVar1;
  undefined1 uVar2;
  InternalMetadataWithArena *this_00;
  string *psVar3;
  SourceCodeInfo *from_00;
  void *pvVar4;
  FileDescriptorProto *in_RSI;
  undefined8 *in_RDI;
  FileOptions *in_stack_000000e8;
  FileOptions *in_stack_000000f0;
  Arena *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  Arena *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffee0;
  
  Message::Message((Message *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  *in_RDI = &PTR__FileDescriptorProto_009630f0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x505174);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffe78);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_fffffffffffffe78);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_fffffffffffffe78);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_stack_fffffffffffffe78
            );
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_fffffffffffffe78);
  RepeatedField<int>::RepeatedField
            ((RepeatedField<int> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedField<int> *)in_stack_fffffffffffffe78);
  RepeatedField<int>::RepeatedField
            ((RepeatedField<int> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (RepeatedField<int> *)in_stack_fffffffffffffe78);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)
               CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (UnknownFieldSet *)in_stack_fffffffffffffe68);
  }
  psVar3 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x16),psVar3);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_name_abi_cxx11_((FileDescriptorProto *)0x505456);
    GetArenaNoVirtual((FileDescriptorProto *)
                      CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,
               (string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
  }
  psVar3 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x17),psVar3);
  uVar2 = _internal_has_package(in_RSI);
  if ((bool)uVar2) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_package_abi_cxx11_((FileDescriptorProto *)0x505609);
    in_stack_fffffffffffffec0 =
         GetArenaNoVirtual((FileDescriptorProto *)
                           CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,
               (string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
  }
  from_00 = (SourceCodeInfo *)internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x18),(string *)from_00);
  bVar1 = _internal_has_syntax(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x5056ba);
    GetArenaNoVirtual((FileDescriptorProto *)
                      CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,
               (string *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
  }
  bVar1 = _internal_has_options((FileDescriptorProto *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  if (bVar1) {
    pvVar4 = operator_new(0xa8);
    FileOptions::FileOptions(in_stack_000000f0,in_stack_000000e8);
    in_RDI[0x19] = pvVar4;
  }
  else {
    in_RDI[0x19] = 0;
  }
  bVar1 = _internal_has_source_code_info
                    ((FileDescriptorProto *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  if (bVar1) {
    pvVar4 = operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)in_stack_fffffffffffffec0,from_00);
    in_RDI[0x1a] = pvVar4;
  }
  else {
    in_RDI[0x1a] = 0;
  }
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      dependency_(from.dependency_),
      message_type_(from.message_type_),
      enum_type_(from.enum_type_),
      service_(from.service_),
      extension_(from.extension_),
      public_dependency_(from.public_dependency_),
      weak_dependency_(from.weak_dependency_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_package()) {
    package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_package(),
      GetArenaNoVirtual());
  }
  syntax_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_syntax()) {
    syntax_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_syntax(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::FileOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  if (from._internal_has_source_code_info()) {
    source_code_info_ = new PROTOBUF_NAMESPACE_ID::SourceCodeInfo(*from.source_code_info_);
  } else {
    source_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorProto)
}